

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O0

void vsencoding::__vseblocks_unpack11(uint32_t *out,uint32_t *in,uint32_t bs)

{
  uint32_t bs_local;
  uint32_t *in_local;
  uint32_t *out_local;
  
  in_local = in;
  out_local = out;
  for (bs_local = bs + 0x1f >> 5; bs_local != 0; bs_local = bs_local - 1) {
    *out_local = *in_local >> 0x15;
    out_local[1] = *in_local >> 10 & 0x7ff;
    out_local[2] = (*in_local & 0x3ff) << 1;
    out_local[2] = in_local[1] >> 0x1f | out_local[2];
    out_local[3] = in_local[1] >> 0x14 & 0x7ff;
    out_local[4] = in_local[1] >> 9 & 0x7ff;
    out_local[5] = (in_local[1] & 0x1ff) << 2;
    out_local[5] = in_local[2] >> 0x1e | out_local[5];
    out_local[6] = in_local[2] >> 0x13 & 0x7ff;
    out_local[7] = in_local[2] >> 8 & 0x7ff;
    out_local[8] = (in_local[2] & 0xff) << 3;
    out_local[8] = in_local[3] >> 0x1d | out_local[8];
    out_local[9] = in_local[3] >> 0x12 & 0x7ff;
    out_local[10] = in_local[3] >> 7 & 0x7ff;
    out_local[0xb] = (in_local[3] & 0x7f) << 4;
    out_local[0xb] = in_local[4] >> 0x1c | out_local[0xb];
    out_local[0xc] = in_local[4] >> 0x11 & 0x7ff;
    out_local[0xd] = in_local[4] >> 6 & 0x7ff;
    out_local[0xe] = (in_local[4] & 0x3f) << 5;
    out_local[0xe] = in_local[5] >> 0x1b | out_local[0xe];
    out_local[0xf] = in_local[5] >> 0x10 & 0x7ff;
    out_local[0x10] = in_local[5] >> 5 & 0x7ff;
    out_local[0x11] = (in_local[5] & 0x1f) << 6;
    out_local[0x11] = in_local[6] >> 0x1a | out_local[0x11];
    out_local[0x12] = in_local[6] >> 0xf & 0x7ff;
    out_local[0x13] = in_local[6] >> 4 & 0x7ff;
    out_local[0x14] = (in_local[6] & 0xf) << 7;
    out_local[0x14] = in_local[7] >> 0x19 | out_local[0x14];
    out_local[0x15] = in_local[7] >> 0xe & 0x7ff;
    out_local[0x16] = in_local[7] >> 3 & 0x7ff;
    out_local[0x17] = (in_local[7] & 7) << 8;
    out_local[0x17] = in_local[8] >> 0x18 | out_local[0x17];
    out_local[0x18] = in_local[8] >> 0xd & 0x7ff;
    out_local[0x19] = in_local[8] >> 2 & 0x7ff;
    out_local[0x1a] = (in_local[8] & 3) << 9;
    out_local[0x1a] = in_local[9] >> 0x17 | out_local[0x1a];
    out_local[0x1b] = in_local[9] >> 0xc & 0x7ff;
    out_local[0x1c] = in_local[9] >> 1 & 0x7ff;
    out_local[0x1d] = (in_local[9] & 1) << 10;
    out_local[0x1d] = in_local[10] >> 0x16 | out_local[0x1d];
    out_local[0x1e] = in_local[10] >> 0xb & 0x7ff;
    out_local[0x1f] = in_local[10] & 0x7ff;
    out_local = out_local + 0x20;
    in_local = in_local + 0xb;
  }
  return;
}

Assistant:

void __vseblocks_unpack11(uint32_t *__restrict__ out,
                          const uint32_t *__restrict__ in, uint32_t bs) {
  for (bs = (bs + 31U) / 32U; bs > 0; out += 32, in += 11, --bs) {
    out[0] = in[0] >> 21;
    out[1] = (in[0] >> 10) & 0x07ff;
    out[2] = (in[0] << 1) & 0x07ff;
    out[2] |= in[1] >> 31;
    out[3] = (in[1] >> 20) & 0x07ff;
    out[4] = (in[1] >> 9) & 0x07ff;
    out[5] = (in[1] << 2) & 0x07ff;
    out[5] |= in[2] >> 30;
    out[6] = (in[2] >> 19) & 0x07ff;
    out[7] = (in[2] >> 8) & 0x07ff;
    out[8] = (in[2] << 3) & 0x07ff;
    out[8] |= in[3] >> 29;
    out[9] = (in[3] >> 18) & 0x07ff;
    out[10] = (in[3] >> 7) & 0x07ff;
    out[11] = (in[3] << 4) & 0x07ff;
    out[11] |= in[4] >> 28;
    out[12] = (in[4] >> 17) & 0x07ff;
    out[13] = (in[4] >> 6) & 0x07ff;
    out[14] = (in[4] << 5) & 0x07ff;
    out[14] |= in[5] >> 27;
    out[15] = (in[5] >> 16) & 0x07ff;
    out[16] = (in[5] >> 5) & 0x07ff;
    out[17] = (in[5] << 6) & 0x07ff;
    out[17] |= in[6] >> 26;
    out[18] = (in[6] >> 15) & 0x07ff;
    out[19] = (in[6] >> 4) & 0x07ff;
    out[20] = (in[6] << 7) & 0x07ff;
    out[20] |= in[7] >> 25;
    out[21] = (in[7] >> 14) & 0x07ff;
    out[22] = (in[7] >> 3) & 0x07ff;
    out[23] = (in[7] << 8) & 0x07ff;
    out[23] |= in[8] >> 24;
    out[24] = (in[8] >> 13) & 0x07ff;
    out[25] = (in[8] >> 2) & 0x07ff;
    out[26] = (in[8] << 9) & 0x07ff;
    out[26] |= in[9] >> 23;
    out[27] = (in[9] >> 12) & 0x07ff;
    out[28] = (in[9] >> 1) & 0x07ff;
    out[29] = (in[9] << 10) & 0x07ff;
    out[29] |= in[10] >> 22;
    out[30] = (in[10] >> 11) & 0x07ff;
    out[31] = in[10] & 0x07ff;
  }
}